

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O2

void __thiscall CS248::DynamicScene::Scene::selectNextHalfedge(Scene *this)

{
  HalfedgeElement *this_00;
  Halfedge *pHVar1;
  
  this_00 = (this->selected).element;
  if (this_00 != (HalfedgeElement *)0x0) {
    pHVar1 = HalfedgeElement::getHalfedge(this_00);
    if (pHVar1 != (Halfedge *)0x0) {
      (this->selected).element = (HalfedgeElement *)((pHVar1->_next)._M_node + 1);
    }
  }
  return;
}

Assistant:

void Scene::selectNextHalfedge() {
  if (selected.element) {
    Halfedge *h = selected.element->getHalfedge();
    if (h) {
      selected.element = elementAddress(h->next());
    }
  }
}